

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::LSTMWeightParams::MergePartialFromCodedStream
          (LSTMWeightParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  int length;
  uint uVar6;
  int byte_limit;
  uint32 uVar7;
  WeightParams *this_00;
  pair<int,_int> pVar8;
  char cVar9;
  ulong uVar10;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar10 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_004940f6;
        uVar10 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = uVar10 | 0x100000000;
    }
    else {
LAB_004940f6:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar10 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar7 | uVar10;
    }
    uVar7 = (uint32)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto switchD_00493d4a_default;
    uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar10;
    if (uVar6 < 0x28) {
      switch(uVar6) {
      case 1:
        if (cVar9 == '\n') {
          this_00 = this->inputgateweightmatrix_;
          if (this_00 == (WeightParams *)0x0) {
            this_00 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(this_00);
            this->inputgateweightmatrix_ = this_00;
          }
          goto LAB_0049409c;
        }
        break;
      case 2:
        if (cVar9 == '\x12') {
          this_00 = this->forgetgateweightmatrix_;
          if (this_00 == (WeightParams *)0x0) {
            this_00 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(this_00);
            this->forgetgateweightmatrix_ = this_00;
          }
          goto LAB_0049409c;
        }
        break;
      case 3:
        if (cVar9 == '\x1a') {
          this_00 = this->blockinputweightmatrix_;
          if (this_00 == (WeightParams *)0x0) {
            this_00 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(this_00);
            this->blockinputweightmatrix_ = this_00;
          }
          goto LAB_0049409c;
        }
        break;
      case 4:
        if (cVar9 == '\"') {
          this_00 = this->outputgateweightmatrix_;
          if (this_00 == (WeightParams *)0x0) {
            this_00 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(this_00);
            this->outputgateweightmatrix_ = this_00;
          }
          goto LAB_0049409c;
        }
        break;
      default:
        switch(uVar6) {
        case 0x14:
          if (cVar9 == -0x5e) {
            this_00 = this->inputgaterecursionmatrix_;
            if (this_00 == (WeightParams *)0x0) {
              this_00 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(this_00);
              this->inputgaterecursionmatrix_ = this_00;
            }
            goto LAB_0049409c;
          }
          break;
        case 0x15:
          if (cVar9 == -0x56) {
            this_00 = this->forgetgaterecursionmatrix_;
            if (this_00 == (WeightParams *)0x0) {
              this_00 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(this_00);
              this->forgetgaterecursionmatrix_ = this_00;
            }
            goto LAB_0049409c;
          }
          break;
        case 0x16:
          if (cVar9 == -0x4e) {
            this_00 = this->blockinputrecursionmatrix_;
            if (this_00 == (WeightParams *)0x0) {
              this_00 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(this_00);
              this->blockinputrecursionmatrix_ = this_00;
            }
            goto LAB_0049409c;
          }
          break;
        case 0x17:
          if (cVar9 == -0x46) {
            this_00 = this->outputgaterecursionmatrix_;
            if (this_00 == (WeightParams *)0x0) {
              this_00 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(this_00);
              this->outputgaterecursionmatrix_ = this_00;
            }
            goto LAB_0049409c;
          }
        }
      }
switchD_00493d4a_default:
      if (uVar7 == 0) {
        return true;
      }
      if ((uVar7 & 7) == 4) {
        return true;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
    }
    else {
      if (uVar6 < 0x3c) {
        switch(uVar6) {
        case 0x28:
          if (cVar9 == 'B') {
            this_00 = this->inputgatebiasvector_;
            if (this_00 == (WeightParams *)0x0) {
              this_00 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(this_00);
              this->inputgatebiasvector_ = this_00;
            }
            goto LAB_0049409c;
          }
          break;
        case 0x29:
          if (cVar9 == 'J') {
            this_00 = this->forgetgatebiasvector_;
            if (this_00 == (WeightParams *)0x0) {
              this_00 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(this_00);
              this->forgetgatebiasvector_ = this_00;
            }
            goto LAB_0049409c;
          }
          break;
        case 0x2a:
          if (cVar9 == 'R') {
            this_00 = this->blockinputbiasvector_;
            if (this_00 == (WeightParams *)0x0) {
              this_00 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(this_00);
              this->blockinputbiasvector_ = this_00;
            }
            goto LAB_0049409c;
          }
          break;
        case 0x2b:
          if (cVar9 == 'Z') {
            this_00 = this->outputgatebiasvector_;
            if (this_00 == (WeightParams *)0x0) {
              this_00 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(this_00);
              this->outputgatebiasvector_ = this_00;
            }
            goto LAB_0049409c;
          }
        }
        goto switchD_00493d4a_default;
      }
      if (uVar6 == 0x3c) {
        if (cVar9 != -0x1e) goto switchD_00493d4a_default;
        this_00 = this->inputgatepeepholevector_;
        if (this_00 == (WeightParams *)0x0) {
          this_00 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(this_00);
          this->inputgatepeepholevector_ = this_00;
        }
      }
      else if (uVar6 == 0x3d) {
        if (cVar9 != -0x16) goto switchD_00493d4a_default;
        this_00 = this->forgetgatepeepholevector_;
        if (this_00 == (WeightParams *)0x0) {
          this_00 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(this_00);
          this->forgetgatepeepholevector_ = this_00;
        }
      }
      else {
        if ((uVar6 != 0x3e) || (cVar9 != -0xe)) goto switchD_00493d4a_default;
        this_00 = this->outputgatepeepholevector_;
        if (this_00 == (WeightParams *)0x0) {
          this_00 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(this_00);
          this->outputgatepeepholevector_ = this_00;
        }
      }
LAB_0049409c:
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < byte_limit)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,byte_limit);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar5 = WeightParams::MergePartialFromCodedStream(this_00,input);
      if (!bVar5) {
        return false;
      }
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar8.first);
    }
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool LSTMWeightParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LSTMWeightParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.WeightParams inputGateWeightMatrix = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inputgateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams forgetGateWeightMatrix = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_forgetgateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams blockInputWeightMatrix = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_blockinputweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateWeightMatrix = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams inputGateRecursionMatrix = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inputgaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams forgetGateRecursionMatrix = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_forgetgaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams blockInputRecursionMatrix = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(178u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_blockinputrecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateRecursionMatrix = 23;
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(186u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams inputGateBiasVector = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inputgatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams forgetGateBiasVector = 41;
      case 41: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(330u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_forgetgatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams blockInputBiasVector = 42;
      case 42: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(338u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_blockinputbiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateBiasVector = 43;
      case 43: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(346u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams inputGatePeepholeVector = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(482u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inputgatepeepholevector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams forgetGatePeepholeVector = 61;
      case 61: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(490u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_forgetgatepeepholevector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGatePeepholeVector = 62;
      case 62: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(498u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgatepeepholevector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LSTMWeightParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LSTMWeightParams)
  return false;
#undef DO_
}